

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

Node * __thiscall DepsLog::GetFirstReverseDepsNode(DepsLog *this,Node *node)

{
  value_type pDVar1;
  Deps *pDVar2;
  reference ppDVar3;
  reference ppNVar4;
  int local_34;
  int i;
  Deps *deps;
  size_t id;
  Node *node_local;
  DepsLog *this_local;
  
  deps = (Deps *)0x0;
  do {
    pDVar2 = (Deps *)std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::size
                               (&this->deps_);
    if (pDVar2 <= deps) {
      return (Node *)0x0;
    }
    ppDVar3 = std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::operator[]
                        (&this->deps_,(size_type)deps);
    pDVar1 = *ppDVar3;
    if (pDVar1 != (value_type)0x0) {
      for (local_34 = 0; local_34 < pDVar1->node_count; local_34 = local_34 + 1) {
        if (pDVar1->nodes[local_34] == node) {
          ppNVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              (&this->nodes_,(size_type)deps);
          return *ppNVar4;
        }
      }
    }
    deps = (Deps *)((long)&deps->mtime + 1);
  } while( true );
}

Assistant:

Node* DepsLog::GetFirstReverseDepsNode(Node* node) {
  for (size_t id = 0; id < deps_.size(); ++id) {
    Deps* deps = deps_[id];
    if (!deps)
      continue;
    for (int i = 0; i < deps->node_count; ++i) {
      if (deps->nodes[i] == node)
        return nodes_[id];
    }
  }
  return NULL;
}